

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O2

CURLcode Curl_auth_create_digest_http_message
                   (Curl_easy *data,char *userp,char *passwdp,uchar *request,uchar *uripath,
                   digestdata *digest,char **outptr,size_t *outlen)

{
  CURLcode CVar1;
  code *convert_to_ascii;
  code *hash;
  
  if (digest->algo - 2U < 4) {
    hash = Curl_sha256it;
    convert_to_ascii = auth_digest_sha256_to_ascii;
  }
  else {
    if (1 < (uint)digest->algo) {
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    hash = Curl_md5it;
    convert_to_ascii = auth_digest_md5_to_ascii;
  }
  CVar1 = _Curl_auth_create_digest_http_message
                    (data,userp,passwdp,request,uripath,digest,outptr,outlen,convert_to_ascii,hash);
  return CVar1;
}

Assistant:

CURLcode Curl_auth_create_digest_http_message(struct Curl_easy *data,
                                              const char *userp,
                                              const char *passwdp,
                                              const unsigned char *request,
                                              const unsigned char *uripath,
                                              struct digestdata *digest,
                                              char **outptr, size_t *outlen)
{
  switch(digest->algo) {
  case CURLDIGESTALGO_MD5:
  case CURLDIGESTALGO_MD5SESS:
    return _Curl_auth_create_digest_http_message(data, userp, passwdp,
                                                 request, uripath, digest,
                                                 outptr, outlen,
                                                 auth_digest_md5_to_ascii,
                                                 Curl_md5it);

  case CURLDIGESTALGO_SHA256:
  case CURLDIGESTALGO_SHA256SESS:
  case CURLDIGESTALGO_SHA512_256:
  case CURLDIGESTALGO_SHA512_256SESS:
    return _Curl_auth_create_digest_http_message(data, userp, passwdp,
                                                 request, uripath, digest,
                                                 outptr, outlen,
                                                 auth_digest_sha256_to_ascii,
                                                 Curl_sha256it);

  default:
    return CURLE_UNSUPPORTED_PROTOCOL;
  }
}